

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_errstr(int rc)

{
  char *pcVar1;
  uint uVar2;
  
  if (rc == 0x204) {
    return "abort due to ROLLBACK";
  }
  if (rc != 0x65) {
    if (rc == 100) {
      return "another row available";
    }
    uVar2 = rc & 0xff;
    pcVar1 = "unknown error";
    if ((uVar2 < 0x1d) && ((0x1410004UL >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
      pcVar1 = (&sqlite3ErrStr_aMsg)[uVar2];
    }
    return pcVar1;
  }
  return "no more rows available";
}

Assistant:

SQLITE_API const char *sqlite3_errstr(int rc){
  return sqlite3ErrStr(rc);
}